

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

bool __thiscall
ON_PostEffects::AddPostEffect
          (ON_PostEffects *this,Types type,ON_UUID *id,wchar_t *param_3,ON_PostEffectParams *params,
          bool is_listable,bool listable_on,bool listable_shown)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ON_PostEffect *this_00;
  long *plVar3;
  ON_XMLNode *pOVar4;
  undefined4 extraout_var_01;
  ON_XMLNode *src;
  ON_PostEffect *pep;
  ON_UUID in_stack_fffffffffffffe48;
  ON_wString local_1a8;
  ON_PostEffectParams *local_1a0;
  ON_XMLProperty local_198;
  ON_PostEffect *local_130;
  ON_XMLVariant local_128;
  undefined4 extraout_var_00;
  
  if (type != Unset) {
    bVar1 = ::operator==(&ON_nil_uuid,id);
    if (param_3 == (wchar_t *)0x0) {
      return false;
    }
    if (bVar1) {
      return false;
    }
    if (*param_3 != L'\0') {
      local_1a0 = params;
      iVar2 = (*this->_vptr_ON_PostEffects[5])(this,id);
      ON_REMOVE_ASAP_AssertEx
                ((uint)(CONCAT44(extraout_var,iVar2) == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_post_effects.cpp"
                 ,0x2c7,"","nullptr == PostEffectFromId(id) is false");
      this_00 = (ON_PostEffect *)operator_new(0x10);
      ON_PostEffect::ON_PostEffect(this_00,this,type,id,param_3);
      local_130 = this_00;
      ON_SimpleArray<ON_PostEffect_*>::Append(&this->_impl->_peps,&local_130);
      iVar2 = (*local_130->_vptr_ON_PostEffect[0x10])();
      plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
      ON_wString::ON_wString((ON_wString *)&stack0xfffffffffffffe50,L"name");
      ::ON_XMLVariant::ON_XMLVariant(&local_128,param_3);
      ON_XMLProperty::ON_XMLProperty(&local_198,(ON_wString *)&stack0xfffffffffffffe50,&local_128);
      (**(code **)(*plVar3 + 0x68))(plVar3,&local_198);
      ON_XMLProperty::~ON_XMLProperty(&local_198);
      ::ON_XMLVariant::~ON_XMLVariant(&local_128);
      ON_wString::~ON_wString((ON_wString *)&stack0xfffffffffffffe50);
      ON_wString::ON_wString((ON_wString *)&stack0xfffffffffffffe50,L"id");
      ON_IdToString(in_stack_fffffffffffffe48);
      ::ON_XMLVariant::ON_XMLVariant(&local_128,&local_1a8);
      ON_XMLProperty::ON_XMLProperty(&local_198,(ON_wString *)&stack0xfffffffffffffe50,&local_128);
      (**(code **)(*plVar3 + 0x68))(plVar3,&local_198);
      ON_XMLProperty::~ON_XMLProperty(&local_198);
      ::ON_XMLVariant::~ON_XMLVariant(&local_128);
      ON_wString::~ON_wString(&local_1a8);
      ON_wString::~ON_wString((ON_wString *)&stack0xfffffffffffffe50);
      if (is_listable) {
        ON_wString::ON_wString((ON_wString *)&stack0xfffffffffffffe50,L"on");
        ::ON_XMLVariant::ON_XMLVariant(&local_128,listable_on);
        ON_XMLProperty::ON_XMLProperty(&local_198,(ON_wString *)&stack0xfffffffffffffe50,&local_128)
        ;
        (**(code **)(*plVar3 + 0x68))(plVar3,&local_198);
        ON_XMLProperty::~ON_XMLProperty(&local_198);
        ::ON_XMLVariant::~ON_XMLVariant(&local_128);
        ON_wString::~ON_wString((ON_wString *)&stack0xfffffffffffffe50);
        ON_wString::ON_wString((ON_wString *)&stack0xfffffffffffffe50,L"shown");
        ::ON_XMLVariant::ON_XMLVariant(&local_128,listable_shown);
        ON_XMLProperty::ON_XMLProperty(&local_198,(ON_wString *)&stack0xfffffffffffffe50,&local_128)
        ;
        (**(code **)(*plVar3 + 0x68))(plVar3,&local_198);
        ON_XMLProperty::~ON_XMLProperty(&local_198);
        ::ON_XMLVariant::~ON_XMLVariant(&local_128);
        ON_wString::~ON_wString((ON_wString *)&stack0xfffffffffffffe50);
      }
      pOVar4 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(pOVar4,L"");
      pOVar4 = (ON_XMLNode *)(**(code **)(*plVar3 + 0x58))(plVar3,pOVar4);
      if (pOVar4 != (ON_XMLNode *)0x0) {
        iVar2 = (*local_1a0->_vptr_ON_PostEffectParams[4])();
        src = ON_XMLParameters::Node((ON_XMLParameters *)CONCAT44(extraout_var_01,iVar2));
        ON_XMLNode::operator=(pOVar4,src);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PostEffects::AddPostEffect(ON_PostEffect::Types type, const ON_UUID& id,
                                   const wchar_t* local_name, const ON_PostEffectParams& params,
                                   bool is_listable, bool listable_on, bool listable_shown)
{
  if (ON_PostEffect::Types::Unset == type)
    return false;

  if (ON_nil_uuid == id)
    return false;

  if ((nullptr == local_name) || (0 == *local_name))
    return false;

  ON_ASSERT(nullptr == PostEffectFromId(id)); // Can't add the same id again.

  auto* pep = new ON_PostEffect(*this, type, id, local_name);
  _impl->_peps.Append(pep); // Critical.

  auto& pep_node = pep->XMLNode();

  // Write the localized name to the XML. This seems wrong at first because one would think we
  // should be writing the English name, but this is not relied on programmatically.
  // It's only written to make the XML text human-readable (assuming you can read that language).
  pep_node.SetProperty(ON_XMLProperty(ON_RDK_PEP_LOCAL_NAME, local_name));

  // Write the id to the XML.
  pep_node.SetProperty(ON_XMLProperty(ON_RDK_PEP_ID, ON_IdToString(id)));

  if (is_listable)
  {
    // Write the listable properties to the XML.
    pep_node.SetProperty(ON_XMLProperty(ON_RDK_PEP_ON, listable_on));
    pep_node.SetProperty(ON_XMLProperty(ON_RDK_PEP_SHOWN, listable_shown));
  }

  // Add the params to the XML.
  ON_XMLNode* pep_param_node = pep_node.AttachChildNode(new ON_XMLNode(L""));
  if (nullptr != pep_param_node)
  {
    *pep_param_node = params.AsXMLParameters().Node();
  }

  return true;
}